

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O3

int __thiscall transwarp::detail::thread_pool::shutdown(thread_pool *this,int __fd,int __how)

{
  int iVar1;
  pointer ptVar2;
  pointer ptVar3;
  thread *thread;
  pointer ptVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  this->done_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  ptVar2 = (pointer)std::condition_variable::notify_all();
  ptVar4 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar4 != ptVar3) {
    do {
      std::thread::join();
      ptVar4 = ptVar4 + 1;
    } while (ptVar4 != ptVar3);
    ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar4 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar3 = ptVar2;
    if (ptVar4 != ptVar2) {
      do {
        if ((ptVar3->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar3 = ptVar3 + 1;
      } while (ptVar3 != ptVar4);
      (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar2;
    }
  }
  return (int)ptVar2;
}

Assistant:

void shutdown() {
        {
            std::lock_guard<std::mutex> lock(mutex_);
            done_ = true;
        }
        cond_var_.notify_all();
        for (std::thread& thread : threads_) {
            thread.join();
        }
        threads_.clear();
    }